

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExpressionNode * __thiscall DL::Parser::gr_expression(Parser *this)

{
  ExpressionNode *this_00;
  vector_t<DataNode_*> local_58;
  Token local_40;
  ExpressionNode *local_18;
  ExpressionNode *node;
  Parser *this_local;
  
  node = (ExpressionNode *)this;
  this_00 = (ExpressionNode *)operator_new(0x38);
  ExpressionNode::ExpressionNode(this_00);
  local_18 = this_00;
  match(&local_40,this,T_Identifier);
  std::__cxx11::string::operator=((string *)local_18,(string *)&local_40.Value);
  Token::~Token(&local_40);
  gr_data_list(&local_58,this);
  std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::operator=
            (&local_18->Nodes,&local_58);
  std::vector<DL::DataNode_*,_std::allocator<DL::DataNode_*>_>::~vector(&local_58);
  return local_18;
}

Assistant:

ExpressionNode* Parser::gr_expression()
{
	ExpressionNode* node = new ExpressionNode;

	node->Name  = match(T_Identifier).Value;
	node->Nodes = gr_data_list();
	return node;
}